

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pszFile)

{
  FILE *__stream;
  SI_Error rc;
  FILE *fp;
  char *a_pszFile_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  __stream = fopen(a_pszFile,"rb");
  if (__stream == (FILE *)0x0) {
    this_local._4_4_ = SI_FILE;
  }
  else {
    this_local._4_4_ = LoadFile(this,(FILE *)__stream);
    fclose(__stream);
  }
  return this_local._4_4_;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::LoadFile(const char *a_pszFile) {
	FILE *fp = NULL;
#if __STDC_WANT_SECURE_LIB__ && !_WIN32_WCE
	fopen_s(&fp, a_pszFile, "rb");
#else  // !__STDC_WANT_SECURE_LIB__
	fp = fopen(a_pszFile, "rb");
#endif  // __STDC_WANT_SECURE_LIB__
	if (!fp) {
		return SI_FILE;
	}
	SI_Error rc = LoadFile(fp);
	fclose(fp);
	return rc;
}